

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O1

void duckdb_je_tcache_arena_associate
               (tsdn_t *tsdn,tcache_slow_t *tcache_slow,tcache_t *tcache,arena_t *arena)

{
  cache_bin_array_descriptor_t *pcVar1;
  pthread_mutex_t *__mutex;
  uint64_t *puVar2;
  witness_t **ppwVar3;
  tcache_slow_t *ptVar4;
  tcache_slow_t *ptVar5;
  cache_bin_array_descriptor_t *pcVar6;
  cache_bin_array_descriptor_t *pcVar7;
  int iVar8;
  
  tcache_slow->arena = arena;
  __mutex = (pthread_mutex_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x48);
  iVar8 = pthread_mutex_trylock(__mutex);
  if (iVar8 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&arena->tcache_ql_mtx);
    (arena->tcache_ql_mtx).field_0.field_0.locked.repr = true;
  }
  puVar2 = &(arena->tcache_ql_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if ((arena->tcache_ql_mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (arena->tcache_ql_mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar3 = &(arena->tcache_ql_mtx).field_0.witness.link.qre_prev;
    *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
  }
  (tcache_slow->link).qre_next = tcache_slow;
  (tcache_slow->link).qre_prev = tcache_slow;
  ptVar4 = (arena->tcache_ql).qlh_first;
  if (ptVar4 != (tcache_slow_t *)0x0) {
    (tcache_slow->link).qre_next = (ptVar4->link).qre_prev;
    (ptVar4->link).qre_prev = tcache_slow;
    ptVar5 = (((tcache_slow->link).qre_prev)->link).qre_next;
    (tcache_slow->link).qre_prev = ptVar5;
    (((ptVar4->link).qre_prev)->link).qre_next = ptVar4;
    (ptVar5->link).qre_next = tcache_slow;
  }
  (arena->tcache_ql).qlh_first = (tcache_slow->link).qre_next;
  pcVar1 = &tcache_slow->cache_bin_array_descriptor;
  (tcache_slow->cache_bin_array_descriptor).link.qre_next = pcVar1;
  (tcache_slow->cache_bin_array_descriptor).link.qre_prev = pcVar1;
  (tcache_slow->cache_bin_array_descriptor).bins = tcache->bins;
  pcVar6 = (arena->cache_bin_array_descriptor_ql).qlh_first;
  if (pcVar6 != (cache_bin_array_descriptor_t *)0x0) {
    pcVar7 = (tcache_slow->cache_bin_array_descriptor).link.qre_prev;
    (pcVar7->link).qre_next = (pcVar6->link).qre_prev;
    (pcVar6->link).qre_prev = pcVar7;
    pcVar7 = (((tcache_slow->cache_bin_array_descriptor).link.qre_prev)->link).qre_next;
    (tcache_slow->cache_bin_array_descriptor).link.qre_prev = pcVar7;
    (((pcVar6->link).qre_prev)->link).qre_next = pcVar6;
    (pcVar7->link).qre_next = pcVar1;
  }
  (arena->cache_bin_array_descriptor_ql).qlh_first = (pcVar1->link).qre_next;
  (arena->tcache_ql_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
tcache_arena_associate(tsdn_t *tsdn, tcache_slow_t *tcache_slow,
    tcache_t *tcache, arena_t *arena) {
	assert(tcache_slow->arena == NULL);
	tcache_slow->arena = arena;

	if (config_stats) {
		/* Link into list of extant tcaches. */
		malloc_mutex_lock(tsdn, &arena->tcache_ql_mtx);

		ql_elm_new(tcache_slow, link);
		ql_tail_insert(&arena->tcache_ql, tcache_slow, link);
		cache_bin_array_descriptor_init(
		    &tcache_slow->cache_bin_array_descriptor, tcache->bins);
		ql_tail_insert(&arena->cache_bin_array_descriptor_ql,
		    &tcache_slow->cache_bin_array_descriptor, link);

		malloc_mutex_unlock(tsdn, &arena->tcache_ql_mtx);
	}
}